

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

DotProductLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::DotProductLayerParams>
          (Arena *arena)

{
  DotProductLayerParams *pDVar1;
  
  if (arena != (Arena *)0x0) {
    pDVar1 = DoCreateMessage<CoreML::Specification::DotProductLayerParams>(arena);
    return pDVar1;
  }
  pDVar1 = (DotProductLayerParams *)operator_new(0x18);
  CoreML::Specification::DotProductLayerParams::DotProductLayerParams(pDVar1,(Arena *)0x0,false);
  return pDVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }